

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O2

void set_character_route(tgestate_t *state,character_t character,route_t route)

{
  byte bVar1;
  ulong uVar2;
  char cVar3;
  undefined7 in_register_00000031;
  vischar_t *vischar;
  
  uVar2 = CONCAT71(in_register_00000031,character) & 0xffffffff;
  bVar1 = state->character_structs[uVar2].character_and_flags;
  if ((bVar1 & 0x40) == 0) {
    state->character_structs[uVar2].route = route;
    return;
  }
  vischar = state->vischars;
  cVar3 = -7;
  do {
    vischar = vischar + 1;
    if ((bVar1 & 0x1f) == vischar->character) {
      vischar->flags = vischar->flags & 0xbf;
      vischar->route = route;
      set_route(state,vischar);
      return;
    }
    cVar3 = cVar3 + '\x01';
  } while (cVar3 != '\0');
  return;
}

Assistant:

static void set_character_route(tgestate_t *state,
                                character_t character,
                                route_t     route)
{
  characterstruct_t *charstr; /* was HL */
  vischar_t         *vischar; /* was HL */
  uint8_t            iters;   /* was B */

  assert(state != NULL);
  ASSERT_CHARACTER_VALID(character);
  ASSERT_ROUTE_VALID(route);

  charstr = &state->character_structs[character];
  if (charstr->character_and_flags & characterstruct_FLAG_ON_SCREEN)
  {
    assert(character == (charstr->character_and_flags & characterstruct_CHARACTER_MASK));

    // Why fetch this copy of character index, is it not the same as the passed-in character?
    // might just be a re-fetch when the original code clobbers register A.
    character = charstr->character_and_flags & characterstruct_CHARACTER_MASK;

    /* Search non-player characters to see if this character is already on-screen. */
    iters = vischars_LENGTH - 1;
    vischar = &state->vischars[1];
    do
    {
      if (character == vischar->character)
        goto found_on_screen; /* Character is on-screen: store to vischar. */
      vischar++;
    }
    while (--iters);

    return; /* Conv: Was goto exit; */
  }

  /* Store to characterstruct only. */
  charstr->route = route;
  return;

  // FUTURE: Move this chunk into the body of the loop above.
found_on_screen:
  vischar->flags &= ~vischar_FLAGS_TARGET_IS_DOOR;
  vischar->route = route;

  set_route(state, vischar); // was fallthrough
}